

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

char ** stb_getopt_param(int *argc,char **argv,char *param)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char **opts_00;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  char *__s;
  char **ppcVar10;
  char **opts;
  char **local_68;
  ulong local_60;
  int local_54;
  char **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_68 = (char **)0x0;
  iVar4 = *argc;
  iVar5 = 1;
  local_38 = param;
  if (1 < iVar4) {
    uVar7 = 1;
    ppcVar10 = (char **)0x0;
    opts_00 = (char **)0x0;
    local_50 = argv;
    do {
      uVar6 = (uint)uVar7;
      pcVar1 = argv[(int)uVar6];
      if (*pcVar1 == '-') {
        cVar8 = pcVar1[1];
        if (cVar8 == '\0') {
          if ((int)(uVar6 + 1) < iVar4) {
            lVar9 = (long)iVar5;
            iVar5 = iVar5 + iVar4 + ~uVar6;
            lVar3 = 0;
            do {
              argv[lVar9 + lVar3] = argv[(int)(uVar6 + 1) + lVar3];
              lVar3 = lVar3 + 1;
            } while (~uVar6 + iVar4 != (int)lVar3);
          }
          break;
        }
        local_48 = pcVar1 + 1;
        iVar4 = 1;
        lVar9 = 1;
        local_60 = uVar7;
        local_54 = iVar5;
        local_40 = pcVar1;
        do {
          pcVar1 = strchr(local_38,(int)cVar8);
          if (pcVar1 == (char *)0x0) {
            pcVar1 = (char *)malloc(2);
            if (pcVar1 == (char *)0x0) {
              return (char **)0x0;
            }
            *pcVar1 = cVar8;
            pcVar1[1] = '\0';
          }
          else {
            if (local_48[lVar9] == '\0') {
              iVar5 = (int)local_60;
              if (iVar5 == *argc + -1) {
                *argc = 0;
                stb_getopt_free(opts_00);
                return (char **)0x0;
              }
              local_60 = (ulong)(iVar5 + 1);
              __s = local_50[(long)iVar5 + 1];
            }
            else {
              __s = local_48 + lVar9;
              sVar2 = strlen(__s);
              iVar4 = iVar4 + (int)sVar2;
            }
            sVar2 = strlen(__s);
            pcVar1 = (char *)malloc((long)((int)sVar2 + 2));
            if (pcVar1 == (char *)0x0) {
              return (char **)0x0;
            }
            *pcVar1 = cVar8;
            strcpy(pcVar1 + 1,__s);
          }
          if ((opts_00 == (char **)0x0) ||
             (*(int *)((long)opts_00 + -0xc) <= *(int *)(opts_00 + -2))) {
            stb__arr_addlen_(&local_68,8,1);
            opts_00 = local_68;
          }
          else {
            *(int *)(opts_00 + -2) = *(int *)(opts_00 + -2) + 1;
            opts_00 = ppcVar10;
          }
          if (opts_00 == (char **)0x0) {
            lVar9 = 0;
          }
          else {
            lVar9 = (long)*(int *)(opts_00 + -2);
          }
          opts_00[lVar9 + -1] = pcVar1;
          cVar8 = local_40[(long)iVar4 + 1];
          lVar9 = (long)iVar4 + 1;
          iVar4 = (int)lVar9;
          ppcVar10 = opts_00;
        } while (cVar8 != '\0');
        iVar4 = *argc;
        argv = local_50;
        uVar7 = local_60;
        iVar5 = local_54;
      }
      else {
        lVar9 = (long)iVar5;
        iVar5 = iVar5 + 1;
        argv[lVar9] = pcVar1;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 < iVar4);
    if ((local_68 != (char **)0x0) && (*(int *)(local_68 + -2) < *(int *)((long)local_68 + -0xc))) {
      *(int *)(local_68 + -2) = *(int *)(local_68 + -2) + 1;
      goto LAB_00153237;
    }
  }
  stb__arr_addlen_(&local_68,8,1);
LAB_00153237:
  local_68[(long)*(int *)(local_68 + -2) + -1] = (char *)0x0;
  *argc = iVar5;
  return local_68;
}

Assistant:

char **stb_getopt_param(int *argc, char **argv, char *param)
{
   char ** opts=NULL;
   int i,j=1;
   for (i=1; i < *argc; ++i) {
      if (argv[i][0] != '-') {
         argv[j++] = argv[i];
      } else {
         if (argv[i][1] == 0) { // plain - == don't parse further options
            ++i;
            while (i < *argc)
               argv[j++] = argv[i++];
            break;
         } else {
            int k;
            char *q = argv[i];  // traverse options list
            for (k=1; q[k]; ++k) {
               char *s;
               if (strchr(param, q[k])) {  // does it take a parameter?
                  char *t = &q[k+1], z = q[k];
                  int len=0;
                  if (*t == 0) {
                     if (i == *argc-1) { // takes a parameter, but none found
                        *argc = 0;
                        stb_getopt_free(opts);
                        return NULL;
                     }
                     t = argv[++i];
                  } else
                     k += strlen(t);
                  len = strlen(t);
                  s = (char *) malloc(len+2);
                  if (!s) return NULL;
                  s[0] = z;
                  strcpy(s+1, t);
               } else {
                  // no parameter
                  s = (char *) malloc(2);
                  if (!s) return NULL;
                  s[0] = q[k];
                  s[1] = 0;
               }
               stb_arr_push(opts, s);
            }
         }
      }
   }
   stb_arr_push(opts, NULL);
   *argc = j;
   return opts;
}